

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_test.cpp
# Opt level: O0

void __thiscall HuffmanTest::test_read_buf(HuffmanTest *this,int number)

{
  int iVar1;
  char *filename;
  int in_ESI;
  HuffmanTest *in_RDI;
  int res;
  BitReader in;
  stringstream os;
  undefined4 in_stack_fffffffffffffe28;
  stringstream *this_00;
  undefined1 expr;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  BitReader *in_stack_fffffffffffffe50;
  BitReader local_1a8;
  stringstream local_198 [16];
  char local_188 [380];
  int local_c [3];
  
  this_00 = local_198;
  local_c[0] = in_ESI;
  std::__cxx11::stringstream::stringstream(this_00);
  BitReader::BitReader(&local_1a8,(istream *)this_00);
  expr = (undefined1)((ulong)this_00 >> 0x38);
  std::ostream::write(local_188,(long)local_c);
  filename = (char *)count_size(in_RDI,local_c[0]);
  iVar1 = BitReader::read_buf(in_stack_fffffffffffffe50,
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  Test::check((bool)expr,(char *)in_RDI,filename,CONCAT44(iVar1,in_stack_fffffffffffffe28));
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void HuffmanTest::test_read_buf(int number) {
    std::stringstream os;
    BitReader in(os);
    os.write(reinterpret_cast<const char *>(&number), sizeof(int));
    int res = in.read_buf(count_size(number));
    DO_CHECK(res == number);
}